

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O0

Var Js::JavascriptMath::Increment_Numeric(Var aRight,ScriptContext *scriptContext)

{
  bool bVar1;
  Var aRight_00;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  
  bVar1 = VarIs<Js::JavascriptBigInt>(aRight);
  if (bVar1) {
    aRight_local = JavascriptBigInt::Increment(aRight);
  }
  else {
    aRight_00 = TaggedInt::ToVarUnchecked(1);
    aRight_local = Add(aRight,aRight_00,scriptContext);
  }
  return aRight_local;
}

Assistant:

Var JavascriptMath::Increment_Numeric(Var aRight, ScriptContext* scriptContext)
        {
            if (VarIs<JavascriptBigInt>(aRight))
            {
                return JavascriptBigInt::Increment(aRight);
            }
            return JavascriptMath::Add(aRight, TaggedInt::ToVarUnchecked(1), scriptContext);
        }